

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

TaskExecutionResult __thiscall
duckdb::UngroupedDistinctAggregateFinalizeTask::AggregateDistinct
          (UngroupedDistinctAggregateFinalizeTask *this)

{
  idx_t *__k;
  unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> *this_00
  ;
  PhysicalUngroupedAggregate *pPVar1;
  size_type __n;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var2;
  ClientContext *context;
  pointer puVar3;
  pointer puVar4;
  undefined8 uVar5;
  bool bVar6;
  SourceResultType SVar7;
  type pDVar8;
  type distinct_data;
  UngroupedDistinctAggregateFinalizeEvent *this_01;
  const_reference this_02;
  pointer this_03;
  BoundAggregateExpression *pBVar9;
  mapped_type *pmVar10;
  reference this_04;
  type this_05;
  type pLVar11;
  reference this_06;
  type sink_p;
  reference this_07;
  reference this_08;
  pointer this_09;
  reference this_10;
  pointer pGVar12;
  reference this_11;
  reference other;
  TaskExecutionResult TVar13;
  size_type __n_00;
  idx_t i;
  size_type __n_01;
  ExecutionContext execution_context;
  OperatorSourceInput source_input;
  DataChunk output_chunk;
  InterruptState interrupt_state;
  DataChunk payload_chunk;
  ThreadContext thread_context;
  ExecutionContext local_1c0;
  __weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> local_1a8 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  OperatorSourceInput local_198;
  undefined1 local_180 [104];
  DataChunk local_118;
  ThreadContext local_d8;
  
  pDVar8 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
           ::operator*(&this->gstate->distinct_state);
  distinct_data =
       unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
       ::operator*(&this->op->distinct_data);
  pPVar1 = this->op;
  ThreadContext::ThreadContext(&local_d8,((this->super_ExecutorTask).executor)->context);
  local_1c0.client = ((this->super_ExecutorTask).executor)->context;
  local_1c0.pipeline.ptr = (Pipeline *)0x0;
  local_1c0.thread = &local_d8;
  this_01 = (UngroupedDistinctAggregateFinalizeEvent *)
            shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  __k = &this->aggregation_idx;
  this_00 = &this->radix_table_lstate;
  __n_00 = this->aggregation_idx;
  do {
    if ((ulong)((long)(pPVar1->aggregates).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar1->aggregates).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n_00) {
      GlobalUngroupedAggregateState::CombineDistinct
                (&this->gstate->state,&this->aggregate_state,distinct_data);
      UngroupedDistinctAggregateFinalizeEvent::FinalizeTask(this_01);
      TVar13 = TASK_FINISHED;
LAB_00969b9c:
      ThreadContext::~ThreadContext(&local_d8);
      return TVar13;
    }
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(&pPVar1->aggregates,__n_00);
    this_03 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_02);
    pBVar9 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_03->super_BaseExpression);
    bVar6 = DistinctAggregateData::IsDistinct(distinct_data,*__k);
    if (bVar6) {
      pmVar10 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&distinct_data->info->table_map,__k);
      __n = *pmVar10;
      this_04 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                ::get<true>(&distinct_data->radix_tables,__n);
      this_05 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                ::operator*(this_04);
      if (this->blocked == false) {
        RadixPartitionedHashTable::GetLocalSourceState
                  ((RadixPartitionedHashTable *)local_180,(ExecutionContext *)this_05);
        uVar5 = local_180._0_8_;
        local_180._0_8_ = (pointer)0x0;
        _Var2._M_head_impl =
             (this_00->
             super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
             .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
        (this_00->
        super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
        .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
             (LocalSourceState *)uVar5;
        if (_Var2._M_head_impl != (LocalSourceState *)0x0) {
          (*(_Var2._M_head_impl)->_vptr_LocalSourceState[1])();
          if ((pointer)local_180._0_8_ != (pointer)0x0) {
            (*(*(_func_int ***)&((_Rep_type *)local_180._0_8_)->_M_impl)[1])();
          }
        }
      }
      pLVar11 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                ::operator*(this_00);
      this_06 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                ::get<true>(&pDVar8->radix_states,__n);
      sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator*(this_06);
      enable_shared_from_this<duckdb::Task>::shared_from_this
                ((enable_shared_from_this<duckdb::Task> *)local_180);
      ::std::__weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<duckdb::Task,void>
                (local_1a8,(__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)local_180);
      InterruptState::InterruptState
                ((InterruptState *)(local_180 + 0x40),(weak_ptr<duckdb::Task,_true> *)local_1a8);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_1a0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180 + 8));
      this_07 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                ::get<true>(&this_01->global_source_states,*__k);
      local_198.global_state =
           unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
           ::operator*(this_07);
      local_198.interrupt_state = (InterruptState *)(local_180 + 0x40);
      local_198.local_state = pLVar11;
      DataChunk::DataChunk((DataChunk *)local_180);
      context = ((this->super_ExecutorTask).executor)->context;
      this_08 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                ::get<true>(&pDVar8->distinct_output_chunks,__n);
      this_09 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator->(this_08);
      DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_118,this_09);
      DataChunk::Initialize
                ((DataChunk *)local_180,context,(vector<duckdb::LogicalType,_true> *)&local_118,
                 0x800);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_118);
      DataChunk::DataChunk(&local_118);
      this_10 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                ::get<true>(&distinct_data->grouped_aggregate_data,__n);
      pGVar12 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                ::operator->(this_10);
      DataChunk::InitializeEmpty(&local_118,&pGVar12->group_types);
      local_118.count = 0;
      while( true ) {
        DataChunk::Reset((DataChunk *)local_180);
        SVar7 = RadixPartitionedHashTable::GetData
                          (this_05,&local_1c0,(DataChunk *)local_180,sink_p,&local_198);
        if (SVar7 == FINISHED) break;
        if (SVar7 == BLOCKED) {
          this->blocked = true;
          DataChunk::~DataChunk(&local_118);
          DataChunk::~DataChunk((DataChunk *)local_180);
          InterruptState::~InterruptState((InterruptState *)(local_180 + 0x40));
          TVar13 = TASK_BLOCKED;
          goto LAB_00969b9c;
        }
        puVar3 = (pBVar9->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar4 = (pBVar9->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (__n_01 = 0; (long)puVar3 - (long)puVar4 >> 3 != __n_01; __n_01 = __n_01 + 1) {
          this_11 = vector<duckdb::Vector,_true>::get<true>(&local_118.data,__n_01);
          other = vector<duckdb::Vector,_true>::get<true>
                            ((vector<duckdb::Vector,_true> *)local_180,__n_01);
          Vector::Reference(this_11,other);
        }
        local_118.count = local_180._24_8_;
        LocalUngroupedAggregateState::Sink(&this->aggregate_state,&local_118,0,*__k);
      }
      this->blocked = false;
      DataChunk::~DataChunk(&local_118);
      DataChunk::~DataChunk((DataChunk *)local_180);
      InterruptState::~InterruptState((InterruptState *)(local_180 + 0x40));
    }
    __n_00 = *__k + 1;
    *__k = __n_00;
  } while( true );
}

Assistant:

TaskExecutionResult UngroupedDistinctAggregateFinalizeTask::AggregateDistinct() {
	D_ASSERT(gstate.distinct_state);
	auto &distinct_state = *gstate.distinct_state;
	auto &distinct_data = *op.distinct_data;

	auto &aggregates = op.aggregates;
	auto &state = aggregate_state;

	// Thread-local contexts
	ThreadContext thread_context(executor.context);
	ExecutionContext execution_context(executor.context, thread_context, nullptr);

	auto &finalize_event = event->Cast<UngroupedDistinctAggregateFinalizeEvent>();

	// Now loop through the distinct aggregates, scanning the distinct HTs

	// This needs to be preserved in case the radix_table.GetData blocks
	auto &agg_idx = aggregation_idx;

	for (; agg_idx < aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			continue;
		}

		const auto table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table = *distinct_data.radix_tables[table_idx];
		if (!blocked) {
			// Because we can block, we need to make sure we preserve this state
			radix_table_lstate = radix_table.GetLocalSourceState(execution_context);
		}
		auto &lstate = *radix_table_lstate;

		auto &sink = *distinct_state.radix_states[table_idx];
		InterruptState interrupt_state(shared_from_this());
		OperatorSourceInput source_input {*finalize_event.global_source_states[agg_idx], lstate, interrupt_state};

		DataChunk output_chunk;
		output_chunk.Initialize(executor.context, distinct_state.distinct_output_chunks[table_idx]->GetTypes());

		DataChunk payload_chunk;
		payload_chunk.InitializeEmpty(distinct_data.grouped_aggregate_data[table_idx]->group_types);
		payload_chunk.SetCardinality(0);

		while (true) {
			output_chunk.Reset();

			auto res = radix_table.GetData(execution_context, output_chunk, sink, source_input);
			if (res == SourceResultType::FINISHED) {
				D_ASSERT(output_chunk.size() == 0);
				break;
			} else if (res == SourceResultType::BLOCKED) {
				blocked = true;
				return TaskExecutionResult::TASK_BLOCKED;
			}

			// We dont need to resolve the filter, we already did this in Sink
			idx_t payload_cnt = aggregate.children.size();
			for (idx_t i = 0; i < payload_cnt; i++) {
				payload_chunk.data[i].Reference(output_chunk.data[i]);
			}
			payload_chunk.SetCardinality(output_chunk);

			// Update the aggregate state
			state.Sink(payload_chunk, 0, agg_idx);
		}
		blocked = false;
	}

	// After scanning the distinct HTs, we can combine the thread-local agg states with the thread-global
	gstate.state.CombineDistinct(state, distinct_data);
	finalize_event.FinalizeTask();
	return TaskExecutionResult::TASK_FINISHED;
}